

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

BOOL DeleteFileW(LPCWSTR lpFileName)

{
  BOOL BVar1;
  DWORD DVar2;
  size_t sVar3;
  char *lpMultiByteStr;
  int *piVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined1 local_70 [8];
  PathCharString namePS;
  
  namePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  namePS._32_8_ = local_70;
  namePS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00122aae;
  CorUnix::InternalGetCurrentThread();
  if (lpFileName == (LPCWSTR)0x0) {
    iVar5 = 0;
  }
  else {
    sVar3 = PAL_wcslen(lpFileName);
    iVar5 = ((int)sVar3 + 1) * MaxWCharToAcpLengthFactor;
  }
  lpMultiByteStr =
       StackString<32UL,_char>::OpenStringBuffer((StackString<32UL,_char> *)local_70,(long)iVar5);
  if (lpMultiByteStr == (char *)0x0) {
    iVar5 = 8;
LAB_00122a76:
    piVar4 = __errno_location();
    *piVar4 = iVar5;
    BVar1 = 0;
  }
  else {
    iVar5 = WideCharToMultiByte(0,0,lpFileName,-1,lpMultiByteStr,iVar5,(LPCSTR)0x0,(LPBOOL)0x0);
    if ((ulong)(long)iVar5 < namePS.m_size) {
      namePS.m_size = (long)iVar5;
    }
    *(undefined1 *)(namePS._32_8_ + namePS.m_size) = 0;
    if (iVar5 == 0) {
      DVar2 = GetLastError();
      if (DVar2 == 0x7a) {
        iVar5 = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00122aae;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","DeleteFileW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x516);
        iVar5 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      }
      goto LAB_00122a76;
    }
    BVar1 = DeleteFileA(lpMultiByteStr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_70);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != namePS.m_count) {
      __stack_chk_fail();
    }
    return BVar1;
  }
LAB_00122aae:
  abort();
}

Assistant:

BOOL
PALAPI
DeleteFileW(
        IN LPCWSTR lpFileName)
{
    CPalThread *pThread;
    int  size;
    PathCharString namePS;
    char * name;
    int length = 0;
    BOOL bRet = FALSE;

    PERF_ENTRY(DeleteFileW);
    ENTRY("DeleteFileW(lpFileName=%p (%S))\n",
      lpFileName?lpFileName:W16_NULLSTRING,
      lpFileName?lpFileName:W16_NULLSTRING);

    pThread = InternalGetCurrentThread();
    
    if (lpFileName != NULL)
    {
        length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    name = namePS.OpenStringBuffer(length);
    if (NULL == name)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }

    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, name, length,
                                NULL, NULL );
    namePS.CloseBuffer(size);
    
    if( size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFilePathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        bRet = FALSE;
        goto done;
    }

    bRet = DeleteFileA( name );

done:
    LOGEXIT("DeleteFileW returns BOOL %d\n", bRet);
    PERF_EXIT(DeleteFileW);
    return bRet;
}